

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

TWords * __thiscall
NJamSpell::TSpellCorrector::Edits(TWords *__return_storage_ptr__,TSpellCorrector *this,TWord *word)

{
  pointer *ppTVar1;
  wstring *pwVar2;
  iterator __position;
  bool bVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *w_1;
  wstring *word_00;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l;
  undefined1 local_b8 [8];
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  cands;
  undefined1 local_90 [8];
  wstring w;
  TWord c;
  undefined1 local_58 [8];
  string s;
  
  local_90 = (undefined1  [8])&w._M_string_length;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_90,word->Ptr,word->Ptr + word->Len);
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetDeletes2((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
               *)local_b8,(wstring *)local_90);
  local_58 = (undefined1  [8])&s._M_string_length;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_58,local_90,(pointer)((long)local_90 + w._M_dataplus._M_p * 4));
  __l._M_len = 1;
  __l._M_array = (iterator)local_58;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)((long)&w.field_2 + 8),__l,(allocator_type *)(s.field_2._M_local_buf + 0xf));
  std::
  vector<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::allocator<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>>
  ::emplace_back<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>
            ((vector<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::allocator<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>>
              *)local_b8,
             (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)((long)&w.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)((long)&w.field_2 + 8));
  if (local_58 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_58);
  }
  if (local_b8 !=
      (undefined1  [8])
      cands.
      super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pwVar2 = (((pointer)local_b8)->
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      cands.
      super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8;
      for (word_00 = (((pointer)local_b8)->
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; word_00 != pwVar2;
          word_00 = word_00 + 1) {
        join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,word_00);
        if (w._32_8_ != 0 && w.field_2._8_8_ != (wchar_t *)0x0) {
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                       __return_storage_ptr__,__position,(TWord *)((long)&w.field_2 + 8));
          }
          else {
            *__position._M_current = join_0x00000010_0x00000000_;
            ppTVar1 = &(__return_storage_ptr__->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
        }
        WideToUTF8((string *)local_58,word_00);
        bVar3 = TBloomFilter::Contains
                          ((this->Deletes1)._M_t.
                           super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                           .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                           (string *)local_58);
        if (bVar3) {
          Inserts(this,word_00,__return_storage_ptr__);
        }
        bVar3 = TBloomFilter::Contains
                          ((this->Deletes2)._M_t.
                           super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                           .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                           (string *)local_58);
        if (bVar3) {
          Inserts2(this,word_00,__return_storage_ptr__);
        }
        if (local_58 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)local_58);
        }
      }
      local_b8 = (undefined1  [8])
                 (cands.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    } while (local_b8 !=
             (undefined1  [8])
             cands.
             super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
             *)local_b8);
  if (local_90 != (undefined1  [8])&w._M_string_length) {
    operator_delete((void *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::Edits(const TWord& word) const {
    std::wstring w(word.Ptr, word.Len);
    TWords result;

    std::vector<std::vector<std::wstring>> cands = GetDeletes2(w);
    cands.push_back(std::vector<std::wstring>({w}));

    for (auto&& w1: cands) {
        for (auto&& w: w1) {
            TWord c = LangModel.GetWord(w);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            std::string s = WideToUTF8(w);
            if (Deletes1->Contains(s)) {
                Inserts(w, result);
            }
            if (Deletes2->Contains(s)) {
                Inserts2(w, result);
            }
        }
    }

    return result;
}